

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::ActivateMorphWeapon(APlayerPawn *this)

{
  player_t *player;
  bool bVar1;
  DPSprite *pDVar2;
  AWeapon *pAVar3;
  FState *state;
  FName local_1c;
  PClassActor *local_18;
  PClassActor *morphweapon;
  APlayerPawn *this_local;
  
  morphweapon = (PClassActor *)this;
  FName::FName(&local_1c,&(this->MorphWeapon).super_FName);
  local_18 = PClass::FindActor(&local_1c);
  ((this->super_AActor).player)->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  if (((this->super_AActor).player)->ReadyWeapon != (AWeapon *)0x0) {
    pDVar2 = player_t::GetPSprite((this->super_AActor).player,PSP_WEAPON);
    pDVar2->y = 32.0;
  }
  if ((local_18 == (PClassActor *)0x0) ||
     (bVar1 = PClass::IsDescendantOf(&local_18->super_PClass,AWeapon::RegistrationInfo.MyClass),
     !bVar1)) {
    ((this->super_AActor).player)->ReadyWeapon = (AWeapon *)0x0;
  }
  else {
    pAVar3 = (AWeapon *)
             AActor::FindInventory(&((this->super_AActor).player)->mo->super_AActor,local_18,false);
    ((this->super_AActor).player)->ReadyWeapon = pAVar3;
    if (((this->super_AActor).player)->ReadyWeapon == (AWeapon *)0x0) {
      pAVar3 = (AWeapon *)
               AActor::GiveInventoryType(&((this->super_AActor).player)->mo->super_AActor,local_18);
      ((this->super_AActor).player)->ReadyWeapon = pAVar3;
      if (((this->super_AActor).player)->ReadyWeapon != (AWeapon *)0x0) {
        ((this->super_AActor).player)->ReadyWeapon->GivenAsMorphWeapon = true;
      }
    }
    if (((this->super_AActor).player)->ReadyWeapon != (AWeapon *)0x0) {
      player = (this->super_AActor).player;
      state = AWeapon::GetReadyState(((this->super_AActor).player)->ReadyWeapon);
      P_SetPsprite(player,PSP_WEAPON,state,false);
    }
  }
  if (((this->super_AActor).player)->ReadyWeapon != (AWeapon *)0x0) {
    P_SetPsprite((this->super_AActor).player,PSP_FLASH,(FState *)0x0,false);
  }
  ((this->super_AActor).player)->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  return;
}

Assistant:

void APlayerPawn::ActivateMorphWeapon ()
{
	PClassActor *morphweapon = PClass::FindActor (MorphWeapon);
	player->PendingWeapon = WP_NOCHANGE;

	if (player->ReadyWeapon != nullptr)
	{
		player->GetPSprite(PSP_WEAPON)->y = WEAPONTOP;
	}

	if (morphweapon == nullptr || !morphweapon->IsDescendantOf (RUNTIME_CLASS(AWeapon)))
	{ // No weapon at all while morphed!
		player->ReadyWeapon = nullptr;
	}
	else
	{
		player->ReadyWeapon = static_cast<AWeapon *>(player->mo->FindInventory (morphweapon));
		if (player->ReadyWeapon == nullptr)
		{
			player->ReadyWeapon = static_cast<AWeapon *>(player->mo->GiveInventoryType (morphweapon));
			if (player->ReadyWeapon != nullptr)
			{
				player->ReadyWeapon->GivenAsMorphWeapon = true; // flag is used only by new beastweap semantics in P_UndoPlayerMorph
			}
		}
		if (player->ReadyWeapon != nullptr)
		{
			P_SetPsprite(player, PSP_WEAPON, player->ReadyWeapon->GetReadyState());
		}
	}

	if (player->ReadyWeapon != nullptr)
	{
		P_SetPsprite(player, PSP_FLASH, nullptr);
	}

	player->PendingWeapon = WP_NOCHANGE;
}